

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedServiceTest_NoGenericServices_Test::
~GeneratedServiceTest_NoGenericServices_Test(GeneratedServiceTest_NoGenericServices_Test *this)

{
  GeneratedServiceTest::~GeneratedServiceTest(&this->super_GeneratedServiceTest);
  operator_delete(this,0x140);
  return;
}

Assistant:

TEST_F(GENERATED_SERVICE_TEST_NAME, NoGenericServices) {
  // Verify that non-services in unittest_no_generic_services.proto were
  // generated.
  ::proto2_unittest::no_generic_services_test::TestMessage message;
  message.set_a(1);
  message.SetExtension(
      ::proto2_unittest::no_generic_services_test::test_extension, 123);
  ::proto2_unittest::no_generic_services_test::TestEnum e =
      ::proto2_unittest::no_generic_services_test::FOO;
  EXPECT_EQ(e, 1);

  // Verify that a ServiceDescriptor is generated for the service even if the
  // class itself is not.
  const FileDescriptor* file =
      ::google::protobuf::unittest::no_generic_services_test::TestMessage::descriptor()
          ->file();

  ASSERT_EQ(1, file->service_count());
  EXPECT_EQ("TestService", file->service(0)->name());
  ASSERT_EQ(1, file->service(0)->method_count());
  EXPECT_EQ("Foo", file->service(0)->method(0)->name());
}